

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O2

int PreLoopInitialize(VP8Encoder *enc)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  VP8BitWriter *bw;
  
  bVar1 = "2\x18\x10\t\a\x05\x03\x02"[enc->base_quant_ >> 4];
  iVar2 = enc->mb_w_;
  iVar3 = enc->mb_h_;
  iVar4 = enc->num_parts_;
  bw = enc->parts_;
  iVar5 = 1;
  lVar6 = 0;
  while( true ) {
    if (iVar5 == 0) {
      VP8EncFreeBitWriters(enc);
      WebPEncodingSetError(enc->pic_,VP8_ENC_ERROR_OUT_OF_MEMORY);
      return iVar5;
    }
    if (enc->num_parts_ <= lVar6) break;
    iVar5 = VP8BitWriterInit(bw,(long)((int)((uint)bVar1 * iVar2 * iVar3) / iVar4));
    lVar6 = lVar6 + 1;
    bw = bw + 1;
  }
  return iVar5;
}

Assistant:

static int PreLoopInitialize(VP8Encoder* const enc) {
  int p;
  int ok = 1;
  const int average_bytes_per_MB = kAverageBytesPerMB[enc->base_quant_ >> 4];
  const int bytes_per_parts =
      enc->mb_w_ * enc->mb_h_ * average_bytes_per_MB / enc->num_parts_;
  // Initialize the bit-writers
  for (p = 0; ok && p < enc->num_parts_; ++p) {
    ok = VP8BitWriterInit(enc->parts_ + p, bytes_per_parts);
  }
  if (!ok) {
    VP8EncFreeBitWriters(enc);  // malloc error occurred
    WebPEncodingSetError(enc->pic_, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return ok;
}